

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O1

int mbedtls_ecp_sw_derive_y(mbedtls_ecp_group *grp,mbedtls_mpi *X,mbedtls_mpi *Y,int parity_bit)

{
  mbedtls_mpi *X_00;
  int iVar1;
  int iVar2;
  undefined1 local_48 [8];
  mbedtls_mpi exp;
  
  X_00 = &grp->P;
  exp._12_4_ = parity_bit;
  iVar1 = mbedtls_mpi_get_bit(X_00,0);
  iVar2 = -0x4e80;
  if ((iVar1 == 1) && (iVar1 = mbedtls_mpi_get_bit(X_00,1), iVar1 == 1)) {
    mbedtls_mpi_init((mbedtls_mpi *)local_48);
    iVar2 = ecp_sw_rhs(grp,Y,X);
    if ((iVar2 == 0) &&
       ((iVar2 = mbedtls_mpi_add_int((mbedtls_mpi *)local_48,X_00,1), iVar2 == 0 &&
        (iVar2 = mbedtls_mpi_shift_r((mbedtls_mpi *)local_48,2), iVar2 == 0)))) {
      iVar2 = mbedtls_mpi_exp_mod(Y,Y,(mbedtls_mpi *)local_48,X_00,(mbedtls_mpi *)0x0);
      if ((iVar2 == 0) && (iVar1 = mbedtls_mpi_get_bit(Y,0), iVar2 = 0, iVar1 != exp._12_4_)) {
        iVar2 = mbedtls_mpi_sub_mpi(Y,X_00,Y);
      }
    }
    mbedtls_mpi_free((mbedtls_mpi *)local_48);
  }
  return iVar2;
}

Assistant:

static int mbedtls_ecp_sw_derive_y(const mbedtls_ecp_group *grp,
                                   const mbedtls_mpi *X,
                                   mbedtls_mpi *Y,
                                   int parity_bit)
{
    /* w = y^2 = x^3 + ax + b
     * y = sqrt(w) = w^((p+1)/4) mod p   (for prime p where p = 3 mod 4)
     *
     * Note: this method for extracting square root does not validate that w
     * was indeed a square so this function will return garbage in Y if X
     * does not correspond to a point on the curve.
     */

    /* Check prerequisite p = 3 mod 4 */
    if (mbedtls_mpi_get_bit(&grp->P, 0) != 1 ||
        mbedtls_mpi_get_bit(&grp->P, 1) != 1) {
        return MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE;
    }

    int ret;
    mbedtls_mpi exp;
    mbedtls_mpi_init(&exp);

    /* use Y to store intermediate result, actually w above */
    MBEDTLS_MPI_CHK(ecp_sw_rhs(grp, Y, X));

    /* w = y^2 */ /* Y contains y^2 intermediate result */
    /* exp = ((p+1)/4) */
    MBEDTLS_MPI_CHK(mbedtls_mpi_add_int(&exp, &grp->P, 1));
    MBEDTLS_MPI_CHK(mbedtls_mpi_shift_r(&exp, 2));
    /* sqrt(w) = w^((p+1)/4) mod p   (for prime p where p = 3 mod 4) */
    MBEDTLS_MPI_CHK(mbedtls_mpi_exp_mod(Y, Y /*y^2*/, &exp, &grp->P, NULL));

    /* check parity bit match or else invert Y */
    /* This quick inversion implementation is valid because Y != 0 for all
     * Short Weierstrass curves supported by mbedtls, as each supported curve
     * has an order that is a large prime, so each supported curve does not
     * have any point of order 2, and a point with Y == 0 would be of order 2 */
    if (mbedtls_mpi_get_bit(Y, 0) != parity_bit) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_sub_mpi(Y, &grp->P, Y));
    }

cleanup:

    mbedtls_mpi_free(&exp);
    return ret;
}